

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnixienumber.cpp
# Opt level: O0

void __thiscall QNixieNumber::paintEvent(QNixieNumber *this,QPaintEvent *param_1)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int local_38;
  int i_1;
  int local_24;
  QPainter local_20 [4];
  int i;
  QPainter paint;
  QPaintEvent *param_1_local;
  QNixieNumber *this_local;
  
  _paint = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  if (this->selectMode_ == NIXIE) {
    for (local_24 = 0; local_24 < this->segment_; local_24 = local_24 + 1) {
      iVar1 = this->width_;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->number,(long)local_24);
      pvVar3 = std::array<QPixmap,_10UL>::operator[](&this->NixieNumber,(long)*pvVar2);
      QPainter::drawPixmap(local_20,iVar1 * local_24,0,pvVar3);
    }
  }
  if (this->selectMode_ == REALNIXIE) {
    for (local_38 = 0; local_38 < this->segment_; local_38 = local_38 + 1) {
      iVar1 = this->width_;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->number,(long)local_38);
      pvVar3 = std::array<QPixmap,_10UL>::operator[](&this->RealNixieNumber,(long)*pvVar2);
      QPainter::drawPixmap(local_20,iVar1 * local_38,0,pvVar3);
    }
  }
  QWidget::update();
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void QNixieNumber::paintEvent(QPaintEvent *)
{
    QPainter paint(this);

    /* Based on the selected style, images (numbers) are drawn from the array */
    if(selectMode_ == NIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, NixieNumber[number[i]]);

    if(selectMode_ == REALNIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, RealNixieNumber[number[i]]);

    QNixieNumber::update();                                      // Automatic redrawing
}